

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_perform(CURL *data)

{
  curl_socket_t cVar1;
  CURLMcode CVar2;
  Curl_multi *m;
  CURLMsg *pCVar3;
  CURLcode result;
  CURLcode CVar4;
  CURLMcode mcode;
  bool bVar5;
  int still_running;
  int local_d4;
  sigpipe_ignore pipe_st;
  
  if (data == (CURL *)0x0) {
    CVar4 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    if (*(undefined1 **)((long)data + 0x1a0) != (undefined1 *)0x0) {
      **(undefined1 **)((long)data + 0x1a0) = 0;
    }
    *(undefined4 *)((long)data + 0xc64) = 0;
    if (*(long *)((long)data + 0x68) == 0) {
      if (*(long *)((long)data + 0x20) != 0) {
        Curl_detach_connection((Curl_easy *)data);
        cVar1 = Curl_getconnectinfo((Curl_easy *)data,(connectdata **)&pipe_st);
        if (pipe_st.old_pipe_act.__sigaction_handler.sa_handler != (__sighandler_t)0x0 &&
            cVar1 != -1) {
          Curl_conn_terminate((Curl_easy *)data,
                              (connectdata *)pipe_st.old_pipe_act.__sigaction_handler.sa_handler,
                              true);
        }
      }
      m = *(Curl_multi **)((long)data + 0x70);
      CVar4 = CURLE_OUT_OF_MEMORY;
      if ((m != (Curl_multi *)0x0) || (m = Curl_multi_handle(0x10,1,3,7,3), m != (Curl_multi *)0x0))
      {
        if ((m->field_0x271 & 4) == 0) {
          curl_multi_setopt(m,CURLMOPT_MAXCONNECTS,(ulong)*(uint *)((long)data + 0xa18));
          *(undefined8 *)((long)data + 0x70) = 0;
          CVar2 = curl_multi_add_handle(m,data);
          if (CVar2 == CURLM_OK) {
            *(Curl_multi **)((long)data + 0x70) = m;
            CVar2 = CURLM_OK;
            memset(&pipe_st,0,0xa0);
            pipe_st._152_1_ = 1;
            if ((*(byte *)((long)data + 0xa30) & 2) == 0) {
              sigpipe_restore(&pipe_st);
              sigpipe_ignore((Curl_easy *)data,&pipe_st);
            }
            CVar4 = CURLE_OK;
            do {
              bVar5 = false;
              while( true ) {
                if ((CVar2 != CURLM_OK) || (bVar5)) {
                  if (CVar2 != CURLM_OK) {
                    CVar4 = (uint)(CVar2 != CURLM_OUT_OF_MEMORY) * 0x10 + CURLE_OUT_OF_MEMORY;
                  }
                  curl_multi_remove_handle(m,data);
                  sigpipe_restore(&pipe_st);
                  return CVar4;
                }
                still_running = 0;
                CVar2 = curl_multi_poll(m,(curl_waitfd *)0x0,0,1000,(int *)0x0);
                if (CVar2 == CURLM_OK) {
                  CVar2 = curl_multi_perform(m,&still_running);
                }
                if (still_running != 0 || CVar2 != CURLM_OK) break;
                pCVar3 = curl_multi_info_read(m,&local_d4);
                bVar5 = pCVar3 != (CURLMsg *)0x0;
                if (bVar5) {
                  CVar4 = (pCVar3->data).result;
                }
              }
            } while( true );
          }
          curl_multi_cleanup(m);
          if (CVar2 != CURLM_OUT_OF_MEMORY) {
            CVar4 = CURLE_FAILED_INIT;
          }
        }
        else {
          CVar4 = CURLE_RECURSIVE_API_CALL;
        }
      }
    }
    else {
      Curl_failf((Curl_easy *)data,"easy handle already used in multi handle");
      CVar4 = CURLE_FAILED_INIT;
    }
  }
  return CVar4;
}

Assistant:

static CURLcode easy_perform(struct Curl_easy *data, bool events)
{
  struct Curl_multi *multi;
  CURLMcode mcode;
  CURLcode result = CURLE_OK;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->set.errorbuffer)
    /* clear this as early as possible */
    data->set.errorbuffer[0] = 0;

  data->state.os_errno = 0;

  if(data->multi) {
    failf(data, "easy handle already used in multi handle");
    return CURLE_FAILED_INIT;
  }

  /* if the handle has a connection still attached (it is/was a connect-only
     handle) then disconnect before performing */
  if(data->conn) {
    struct connectdata *c;
    curl_socket_t s;
    Curl_detach_connection(data);
    s = Curl_getconnectinfo(data, &c);
    if((s != CURL_SOCKET_BAD) && c) {
      Curl_conn_terminate(data, c, TRUE);
    }
    DEBUGASSERT(!data->conn);
  }

  if(data->multi_easy)
    multi = data->multi_easy;
  else {
    /* this multi handle will only ever have a single easy handle attached to
       it, so make it use minimal hash sizes */
    multi = Curl_multi_handle(16, 1, 3, 7, 3);
    if(!multi)
      return CURLE_OUT_OF_MEMORY;
  }

  if(multi->in_callback)
    return CURLE_RECURSIVE_API_CALL;

  /* Copy the MAXCONNECTS option to the multi handle */
  curl_multi_setopt(multi, CURLMOPT_MAXCONNECTS, (long)data->set.maxconnects);

  data->multi_easy = NULL; /* pretend it does not exist */
  mcode = curl_multi_add_handle(multi, data);
  if(mcode) {
    curl_multi_cleanup(multi);
    if(mcode == CURLM_OUT_OF_MEMORY)
      return CURLE_OUT_OF_MEMORY;
    return CURLE_FAILED_INIT;
  }

  /* assign this after curl_multi_add_handle() */
  data->multi_easy = multi;

  sigpipe_init(&pipe_st);
  sigpipe_apply(data, &pipe_st);

  /* run the transfer */
  result = events ? easy_events(multi) : easy_transfer(multi);

  /* ignoring the return code is not nice, but atm we cannot really handle
     a failure here, room for future improvement! */
  (void)curl_multi_remove_handle(multi, data);

  sigpipe_restore(&pipe_st);

  /* The multi handle is kept alive, owned by the easy handle */
  return result;
}